

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

int test_relprod(void)

{
  MTBDD vars_00;
  MTBDD arg_2;
  BDD BVar1;
  BDD BVar2;
  BDD BVar3;
  BDDVAR in_ECX;
  undefined8 uVar4;
  char *pcVar5;
  uint8_t local_99 [33];
  uint8_t local_78 [8];
  uint8_t local_70 [8];
  uint8_t local_68 [8];
  uint8_t local_60 [8];
  BDDVAR vars [3];
  BDDVAR all_vars [6];
  
  vars[0] = 0;
  vars[1] = 2;
  vars[2] = 4;
  all_vars[0] = 0;
  all_vars[1] = 1;
  all_vars[2] = 2;
  all_vars[3] = 3;
  all_vars[4] = 4;
  all_vars[5] = 5;
  vars_00 = mtbdd_set_from_array(vars,3);
  arg_2 = mtbdd_set_from_array(all_vars,6);
  local_60[0] = '\0';
  local_60[1] = '\x01';
  local_60[2] = '\0';
  local_60[3] = '\x01';
  local_60[4] = '\0';
  local_60[5] = '\x01';
  BVar1 = sylvan_union_cube_RUN(0,arg_2,local_60);
  local_68[0] = '\x01';
  local_68[1] = '\0';
  local_68[2] = '\x02';
  local_68[3] = '\0';
  local_68[4] = '\x02';
  local_68[5] = '\0';
  BVar1 = sylvan_union_cube_RUN(BVar1,arg_2,local_68);
  local_70[0] = '\x02';
  local_70[1] = '\0';
  local_70[2] = '\x01';
  local_70[3] = '\0';
  local_70[4] = '\x02';
  local_70[5] = '\0';
  BVar1 = sylvan_union_cube_RUN(BVar1,arg_2,local_70);
  local_78[0] = '\x02';
  local_78[1] = '\0';
  local_78[2] = '\x02';
  local_78[3] = '\0';
  local_78[4] = '\x01';
  local_78[5] = '\0';
  BVar1 = sylvan_union_cube_RUN(BVar1,arg_2,local_78);
  local_99[6] = '\0';
  local_99[7] = '\0';
  local_99[8] = 1;
  BVar2 = sylvan_cube(vars_00,local_99 + 6);
  local_99[3] = '\0';
  local_99[4] = '\0';
  local_99[5] = 0;
  BVar3 = sylvan_cube(vars_00,local_99 + 3);
  local_99[0] = '\x01';
  local_99[1] = '\x01';
  local_99[2] = 1;
  sylvan_cube(vars_00,local_99);
  BVar2 = sylvan_relnext_RUN(BVar2,BVar1,arg_2,in_ECX);
  sylvan_relprev_RUN(BVar1,BVar2,arg_2,in_ECX);
  if (BVar2 == BVar3) {
    pcVar5 = "prev == sylvan_not(zeroes)";
    uVar4 = 0x17f;
  }
  else {
    pcVar5 = "next == zeroes";
    uVar4 = 0x17e;
  }
  fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
          "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c",
          uVar4,"int test_relprod()",pcVar5);
  return 1;
}

Assistant:

int
test_relprod()
{
    BDDVAR vars[] = {0,2,4};
    BDDVAR all_vars[] = {0,1,2,3,4,5};

    BDDSET vars_set = sylvan_set_fromarray(vars, 3);
    BDDSET all_vars_set = sylvan_set_fromarray(all_vars, 6);

    BDD s, t, next, prev;
    BDD zeroes, ones;

    // transition relation: 000 --> 111 and !000 --> 000
    t = sylvan_false;
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){0,1,0,1,0,1}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){1,0,2,0,2,0}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){2,0,1,0,2,0}));
    t = sylvan_union_cube(t, all_vars_set, ((uint8_t[]){2,0,2,0,1,0}));

    s = sylvan_cube(vars_set, (uint8_t[]){0,0,1});
    zeroes = sylvan_cube(vars_set, (uint8_t[]){0,0,0});
    ones = sylvan_cube(vars_set, (uint8_t[]){1,1,1});

    next = sylvan_relnext(s, t, all_vars_set);
    prev = sylvan_relprev(t, next, all_vars_set);
    test_assert(next == zeroes);
    test_assert(prev == sylvan_not(zeroes));

    next = sylvan_relnext(next, t, all_vars_set);
    prev = sylvan_relprev(t, next, all_vars_set);
    test_assert(next == ones);
    test_assert(prev == zeroes);

    t = sylvan_cube(all_vars_set, (uint8_t[]){0,0,0,0,0,1});
    test_assert(sylvan_relprev(t, s, all_vars_set) == zeroes);
    test_assert(sylvan_relprev(t, sylvan_not(s), all_vars_set) == sylvan_false);
    test_assert(sylvan_relnext(s, t, all_vars_set) == sylvan_false);
    test_assert(sylvan_relnext(zeroes, t, all_vars_set) == s);

    t = sylvan_cube(all_vars_set, (uint8_t[]){0,0,0,0,0,2});
    test_assert(sylvan_relprev(t, s, all_vars_set) == zeroes);
    test_assert(sylvan_relprev(t, zeroes, all_vars_set) == zeroes);
    test_assert(sylvan_relnext(sylvan_not(zeroes), t, all_vars_set) == sylvan_false);

    return 0;
}